

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void argsman_tests::util_ParseParameters_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  util_ParseParameters t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1f8;
  std_string *in_stack_fffffffffffff200;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff208;
  util_ParseParameters *in_stack_fffffffffffff218;
  const_string *in_stack_fffffffffffff220;
  const_string *msg;
  size_t in_stack_fffffffffffff228;
  size_t line_num;
  const_string *in_stack_fffffffffffff230;
  unit_test_log_t *in_stack_fffffffffffff238;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [408];
  util_ParseParameters local_5d8;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  util_ParseParameters::util_ParseParameters(in_stack_fffffffffffff218);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [16])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::setup_conditional<argsman_tests::util_ParseParameters>
            ((util_ParseParameters *)0x36f090);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [13])in_stack_fffffffffffff200);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  util_ParseParameters::test_method(&local_5d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  this = boost::operator<<(in_stack_fffffffffffff208,(char (*) [19])in_stack_fffffffffffff200);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff208);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff228,
             in_stack_fffffffffffff220);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::unit_test::teardown_conditional<argsman_tests::util_ParseParameters>
            ((util_ParseParameters *)0x36f2b6);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
             (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
  msg = local_c38;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1f8);
  boost::operator<<(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
  boost::operator<<(in_stack_fffffffffffff208,(char (*) [21])in_stack_fffffffffffff200);
  this_00 = boost::operator<<(in_stack_fffffffffffff208,(char (*) [15])in_stack_fffffffffffff200);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1f8);
  util_ParseParameters::~util_ParseParameters((util_ParseParameters *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseParameters)
{
    TestArgsManager testArgs;
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);

    const char *argv_test[] = {"-ignored", "-a", "-b", "-ccc=argument", "-ccc=multiple", "f", "-d=e"};

    std::string error;
    LOCK(testArgs.cs_args);
    testArgs.SetupArgs({a, b, ccc, d});
    BOOST_CHECK(testArgs.ParseParameters(0, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(1, argv_test, error));
    BOOST_CHECK(testArgs.m_settings.command_line_options.empty() && testArgs.m_settings.ro_config.empty());

    BOOST_CHECK(testArgs.ParseParameters(7, argv_test, error));
    // expectation: -ignored is ignored (program name argument),
    // -a, -b and -ccc end up in map, -d ignored because it is after
    // a non-option argument (non-GNU option parsing)
    BOOST_CHECK(testArgs.m_settings.command_line_options.size() == 3 && testArgs.m_settings.ro_config.empty());
    BOOST_CHECK(testArgs.IsArgSet("-a") && testArgs.IsArgSet("-b") && testArgs.IsArgSet("-ccc")
                && !testArgs.IsArgSet("f") && !testArgs.IsArgSet("-d"));
    BOOST_CHECK(testArgs.m_settings.command_line_options.count("a") && testArgs.m_settings.command_line_options.count("b") && testArgs.m_settings.command_line_options.count("ccc")
                && !testArgs.m_settings.command_line_options.count("f") && !testArgs.m_settings.command_line_options.count("d"));

    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].size() == 1);
    BOOST_CHECK(testArgs.m_settings.command_line_options["a"].front().get_str() == "");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].size() == 2);
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].front().get_str() == "argument");
    BOOST_CHECK(testArgs.m_settings.command_line_options["ccc"].back().get_str() == "multiple");
    BOOST_CHECK(testArgs.GetArgs("-ccc").size() == 2);
}